

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O3

void TestReadSome(void)

{
  ostream *poVar1;
  long lVar2;
  size_t sVar3;
  int iVar5;
  long *plVar6;
  size_t in;
  size_t bytesAvail;
  size_t *local_1760;
  size_t *local_1758;
  string junk;
  assertion_result local_1730;
  const_string local_1718;
  lazy_ostream local_1708;
  undefined8 *local_16f8;
  char *local_16f0;
  undefined **local_16e8;
  undefined1 local_16e0;
  undefined8 *local_16d8;
  size_t **local_16d0;
  undefined **local_16c8;
  undefined1 local_16c0;
  undefined8 *local_16b8;
  size_t **local_16b0;
  ostream os;
  istream is;
  char datain [5000];
  long lVar4;
  
  is.super_istream._vptr_basic_istream = (_func_int **)anon_var_dwarf_a2e99;
  is.super_istream._M_gcount =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  is.super_istream._16_8_ = 0x1f8;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&is);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  os.super_ostream._vptr_basic_ostream =
       (_func_int **)CONCAT71(os.super_ostream._vptr_basic_ostream._1_7_,1);
  datain[8] = '\0';
  datain._0_8_ = &PTR__lazy_ostream_001dca70;
  datain._16_8_ = &boost::unit_test::lazy_ostream::inst;
  datain._24_8_ = anon_var_dwarf_a4421;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(lazy_ostream *)datain);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&os);
  makeString_abi_cxx11_(&junk,0x800);
  avro::ostream::ostream(&os);
  iVar5 = 5;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              (&os.super_ostream,junk._M_dataplus._M_p,junk._M_string_length);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Buffer has ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bytes\n",7);
  avro::istream::istream(&is,(OutputBuffer *)&os.super_ostream.field_0x48);
  do {
    plVar6 = *(long **)(&is.super_istream.field_0xe8 +
                       (long)is.super_istream._vptr_basic_istream[-3]);
    lVar2 = plVar6[2];
    lVar4 = plVar6[3];
    if (lVar4 == lVar2) {
      lVar2 = (**(code **)(*plVar6 + 0x38))();
      if (lVar2 == 0) {
        is.super_istream._vptr_basic_istream = (_func_int **)(avro::istream::vtable + 0x18);
        is.super_istream._136_8_ = 0x1db690;
        is.super_istream._16_8_ = &PTR__istreambuf_001db718;
        boost::detail::shared_count::~shared_count((shared_count *)&is.super_istream.field_0x58);
        is.super_istream._16_8_ = sysconf;
        std::locale::~locale((locale *)&is.super_istream.field_0x48);
        is.super_istream._vptr_basic_istream =
             (_func_int **)(std::istream-in-avro::istream::construction_vtable + 0x18);
        is.super_istream._136_8_ = 0x1db6e0;
        is.super_istream._M_gcount = 0;
        std::ios_base::~ios_base((ios_base *)&is.super_istream.field_0x88);
        os.super_ostream._vptr_basic_ostream = (_func_int **)(avro::ostream::vtable + 0x18);
        os.super_ostream._88_8_ = 0x1db8a0;
        os.super_ostream._8_8_ = &PTR__ostreambuf_001db928;
        boost::detail::shared_count::~shared_count((shared_count *)&os.super_ostream.field_0x50);
        os.super_ostream._8_8_ = sysconf;
        std::locale::~locale((locale *)&os.super_ostream.field_0x40);
        std::ios_base::~ios_base((ios_base *)&os.super_ostream.field_0x58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)junk._M_dataplus._M_p != &junk.field_2) {
          operator_delete(junk._M_dataplus._M_p,junk.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      plVar6 = *(long **)(&is.super_istream.field_0xe8 +
                         (long)is.super_istream._vptr_basic_istream[-3]);
      lVar2 = plVar6[2];
      lVar4 = plVar6[3];
    }
    sVar3 = lVar4 - lVar2;
    if (sVar3 == 0) {
      sVar3 = (**(code **)(*plVar6 + 0x38))();
    }
    bytesAvail = sVar3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bytes avail = ",0xe);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    in = std::istream::readsome((char *)&is,(long)datain);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bytes read = ",0xd);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    boost::unit_test::anon_unknown_0::s_log_impl();
    std::__cxx11::string::_M_replace
              (0x1df890,0,
               (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                       m_message._M_string_length,0x1b937c);
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
    boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x20f;
    local_1708.m_empty = false;
    local_1708._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
    local_16f8 = &boost::unit_test::lazy_ostream::inst;
    local_16f0 = "";
    local_1730.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(bytesAvail == in);
    local_1730.m_message.px = (element_type *)0x0;
    local_1730.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1718.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_1718.m_end = "";
    local_1758 = &bytesAvail;
    local_16c0 = 0;
    local_16c8 = &PTR__lazy_ostream_001dc7f0;
    local_16b8 = &boost::unit_test::lazy_ostream::inst;
    local_16b0 = &local_1758;
    local_1760 = &in;
    local_16e0 = 0;
    local_16e8 = &PTR__lazy_ostream_001dc7f0;
    local_16d8 = &boost::unit_test::lazy_ostream::inst;
    local_16d0 = &local_1760;
    boost::test_tools::tt_detail::report_assertion
              (&local_1730,&local_1708,&local_1718,0x20f,CHECK,CHECK_EQUAL,2,"bytesAvail",
               &local_16c8,"in",&local_16e8);
    boost::detail::shared_count::~shared_count(&local_1730.m_message.pn);
  } while( true );
}

Assistant:

void TestReadSome()
{
    BOOST_TEST_MESSAGE( "TestReadSome");
    {
        std::string junk = makeString(kDefaultBlockSize/2);

        ostream os;

        // write enough bytes to a buffer, to create at least 3 blocks
        int i = 0;
        for(; i < 5; ++i) {
            os << junk;
        }

        cout << "Buffer has " << os.getBuffer().size() << " bytes\n";

        istream is(os.getBuffer());

        char datain[5000];

        while(is.rdbuf()->in_avail()) {
            size_t bytesAvail = static_cast<size_t>(is.rdbuf()->in_avail());
            cout << "Bytes avail = " << bytesAvail << endl;
            size_t in = static_cast<size_t>(is.readsome(datain, sizeof(datain)));
            cout << "Bytes read = " << in << endl;
            BOOST_CHECK_EQUAL(bytesAvail, in);
        }
    }
}